

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

int __thiscall xmrig::Client::connect(Client *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  void *pvVar1;
  int extraout_EAX;
  long lVar2;
  uintptr_t *puVar3;
  uv_tcp_t *puVar4;
  undefined8 uVar5;
  undefined4 in_register_00000034;
  
  if ((this->super_BaseClient).m_state != ConnectingState) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    this->m_expire = lVar2 / 1000000 + 20000;
    (this->super_BaseClient).m_state = ConnectingState;
  }
  puVar3 = (uintptr_t *)operator_new(0x60);
  pvVar1 = (void *)this->m_key;
  *puVar3 = (uintptr_t)pvVar1;
  puVar4 = (uv_tcp_t *)operator_new(0xf8);
  this->m_socket = puVar4;
  puVar4->data = pvVar1;
  uVar5 = uv_default_loop();
  uv_tcp_init(uVar5,this->m_socket);
  uv_tcp_nodelay(this->m_socket,1);
  uv_tcp_keepalive(this->m_socket,1,0x3c);
  uv_tcp_connect(puVar3,this->m_socket,(void *)CONCAT44(in_register_00000034,__fd),onConnect);
  operator_delete((void *)CONCAT44(in_register_00000034,__fd));
  return extraout_EAX;
}

Assistant:

void xmrig::Client::connect(sockaddr *addr)
{
    setState(ConnectingState);

    uv_connect_t *req = new uv_connect_t;
    req->data = m_storage.ptr(m_key);

    m_socket = new uv_tcp_t;
    m_socket->data = m_storage.ptr(m_key);

    uv_tcp_init(uv_default_loop(), m_socket);
    uv_tcp_nodelay(m_socket, 1);

#   ifndef WIN32
    uv_tcp_keepalive(m_socket, 1, 60);
#   endif

    uv_tcp_connect(req, m_socket, addr, onConnect);

    delete addr;
}